

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall thread::ThreadPool::ThreadPool(ThreadPool *this,int size)

{
  undefined1 auVar1 [16];
  ulong *puVar2;
  Thread *pTVar3;
  Thread *pTVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  this->started = false;
  this->threadsize = size;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x30),8) == 0) {
    uVar5 = SUB168(auVar1 * ZEXT816(0x30),0) | 8;
  }
  puVar2 = (ulong *)operator_new__(uVar5);
  *puVar2 = uVar6;
  pTVar3 = (Thread *)(puVar2 + 1);
  if (size != 0) {
    pTVar4 = pTVar3;
    do {
      pTVar4->threadid = 0;
      pTVar4->isstart = false;
      *(undefined8 *)&(pTVar4->threadfunc).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(pTVar4->threadfunc).super__Function_base._M_functor + 8) = 0;
      (pTVar4->threadfunc).super__Function_base._M_manager = (_Manager_type)0x0;
      (pTVar4->threadfunc)._M_invoker = (_Invoker_type)0x0;
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar3 + uVar6);
  }
  this->threadlistptr = pTVar3;
  *(undefined8 *)&(this->threadfunc).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->threadfunc).super__Function_base._M_functor + 8) = 0;
  (this->threadfunc).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->threadfunc)._M_invoker = (_Invoker_type)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->taskqueue).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map(&(this->taskqueue).
                     super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    ,0);
  (this->mutex).pid = 0;
  pthread_mutex_init((pthread_mutex_t *)&(this->mutex).mutex,(pthread_mutexattr_t *)0x0);
  (this->cond).mutex = &this->mutex;
  pthread_cond_init((pthread_cond_t *)&(this->cond).cond,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

explicit ThreadPool(int size = 2) : 
                started(false),
                threadsize(size),
                threadlistptr(new Thread[size]),
                mutex(),
                cond(mutex)
            {}